

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O0

string * ScriptToAsmStr_abi_cxx11_(CScript *script,bool fAttemptSighashDecode)

{
  long lVar1;
  undefined1 uVar2;
  bool bVar3;
  const_iterator nMaxNumSize;
  const_iterator pc_00;
  size_type sVar4;
  byte in_DL;
  string *in_RDI;
  long in_FS_OFFSET;
  string *str;
  const_iterator it;
  uchar chSigHashType;
  const_iterator pc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  opcodetype opcode;
  string strSigHashDecode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  const_iterator in_stack_fffffffffffffe18;
  undefined6 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  int in_stack_fffffffffffffe28;
  undefined2 in_stack_fffffffffffffe2c;
  undefined1 in_stack_fffffffffffffe2e;
  string *this;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  const_iterator vch_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  Span<const_unsigned_char> in_stack_fffffffffffffe90;
  int local_10c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe27,
                      CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe08);
  nMaxNumSize = prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                           in_stack_fffffffffffffe10);
  do {
    pc_00 = prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffe10
                      );
    vch_00 = pc_00;
    uVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator<
                      ((const_iterator *)in_stack_fffffffffffffe10,
                       (const_iterator)in_stack_fffffffffffffe18._M_node);
    if (!(bool)uVar2) {
LAB_001bfc69:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffe18._M_node);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return in_RDI;
      }
      __stack_chk_fail();
    }
    bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (in_stack_fffffffffffffe08);
    if (!bVar3) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe18._M_node,(char *)in_stack_fffffffffffffe10);
    }
    in_stack_fffffffffffffe2e =
         CScript::GetOp((CScript *)this,(const_iterator *)pc_00.ptr,
                        (opcodetype *)
                        CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffe2e,
                                                CONCAT24(in_stack_fffffffffffffe2c,
                                                         in_stack_fffffffffffffe28))),
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT17(in_stack_fffffffffffffe27,
                                 CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)));
    if (!(bool)in_stack_fffffffffffffe2e) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe18._M_node,(char *)in_stack_fffffffffffffe10);
      goto LAB_001bfc69;
    }
    if ((local_10c < 0) || (0x4e < local_10c)) {
      GetOpName_abi_cxx11_(strSigHashDecode.field_2._12_4_);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe18._M_node,in_stack_fffffffffffffe10);
      std::__cxx11::string::~string(in_stack_fffffffffffffe08);
    }
    else {
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffe08);
      if (sVar4 < 5) {
        CScriptNum::CScriptNum
                  ((CScriptNum *)in_stack_fffffffffffffe60,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)vch_00.ptr,
                   SUB41((uint)in_stack_fffffffffffffe54 >> 0x18,0),(size_t)nMaxNumSize.ptr);
        in_stack_fffffffffffffe28 =
             CScriptNum::getint((CScriptNum *)
                                CONCAT17(in_stack_fffffffffffffe27,
                                         CONCAT16(in_stack_fffffffffffffe26,
                                                  in_stack_fffffffffffffe20)));
        tinyformat::format<int>((char *)this,(int *)pc_00.ptr);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe18._M_node,in_stack_fffffffffffffe10);
        std::__cxx11::string::~string(in_stack_fffffffffffffe08);
      }
      else if (((in_DL & 1) == 0) ||
              (in_stack_fffffffffffffe27 =
                    CScript::IsUnspendable((CScript *)in_stack_fffffffffffffe10),
              (bool)in_stack_fffffffffffffe27)) {
        Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((Span<const_unsigned_char> *)in_stack_fffffffffffffe18._M_node,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        HexStr_abi_cxx11_(in_stack_fffffffffffffe90);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe18._M_node,in_stack_fffffffffffffe10);
        std::__cxx11::string::~string(in_stack_fffffffffffffe08);
      }
      else {
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe27,
                            CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)));
        in_stack_fffffffffffffe26 =
             CheckSignatureEncoding
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT17(in_stack_fffffffffffffe27,
                                 CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
                        (uint)((ulong)in_stack_fffffffffffffe18._M_node >> 0x20),
                        (ScriptError *)in_stack_fffffffffffffe10);
        if ((bool)in_stack_fffffffffffffe26) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffe08);
          in_stack_fffffffffffffe18 =
               std::
               map<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find((map<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffe10,(key_type *)in_stack_fffffffffffffe08);
          std::
          map<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end((map<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffe10);
          bVar3 = std::operator==((_Self *)in_stack_fffffffffffffe18._M_node,
                                  (_Self *)in_stack_fffffffffffffe10);
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            std::
            _Rb_tree_const_iterator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffe08);
            std::operator+((char *)vch_00.ptr,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffe27,
                                    CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
                           (char *)in_stack_fffffffffffffe18._M_node);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
            std::__cxx11::string::~string(in_stack_fffffffffffffe08);
            std::__cxx11::string::~string(in_stack_fffffffffffffe08);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::pop_back
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffe08);
          }
        }
        Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((Span<const_unsigned_char> *)in_stack_fffffffffffffe18._M_node,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        HexStr_abi_cxx11_(in_stack_fffffffffffffe90);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffe27,
                                CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe18._M_node);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe18._M_node,in_stack_fffffffffffffe10);
        std::__cxx11::string::~string(in_stack_fffffffffffffe08);
        std::__cxx11::string::~string(in_stack_fffffffffffffe08);
        std::__cxx11::string::~string(in_stack_fffffffffffffe08);
      }
    }
  } while( true );
}

Assistant:

std::string ScriptToAsmStr(const CScript& script, const bool fAttemptSighashDecode)
{
    std::string str;
    opcodetype opcode;
    std::vector<unsigned char> vch;
    CScript::const_iterator pc = script.begin();
    while (pc < script.end()) {
        if (!str.empty()) {
            str += " ";
        }
        if (!script.GetOp(pc, opcode, vch)) {
            str += "[error]";
            return str;
        }
        if (0 <= opcode && opcode <= OP_PUSHDATA4) {
            if (vch.size() <= static_cast<std::vector<unsigned char>::size_type>(4)) {
                str += strprintf("%d", CScriptNum(vch, false).getint());
            } else {
                // the IsUnspendable check makes sure not to try to decode OP_RETURN data that may match the format of a signature
                if (fAttemptSighashDecode && !script.IsUnspendable()) {
                    std::string strSigHashDecode;
                    // goal: only attempt to decode a defined sighash type from data that looks like a signature within a scriptSig.
                    // this won't decode correctly formatted public keys in Pubkey or Multisig scripts due to
                    // the restrictions on the pubkey formats (see IsCompressedOrUncompressedPubKey) being incongruous with the
                    // checks in CheckSignatureEncoding.
                    if (CheckSignatureEncoding(vch, SCRIPT_VERIFY_STRICTENC, nullptr)) {
                        const unsigned char chSigHashType = vch.back();
                        const auto it = mapSigHashTypes.find(chSigHashType);
                        if (it != mapSigHashTypes.end()) {
                            strSigHashDecode = "[" + it->second + "]";
                            vch.pop_back(); // remove the sighash type byte. it will be replaced by the decode.
                        }
                    }
                    str += HexStr(vch) + strSigHashDecode;
                } else {
                    str += HexStr(vch);
                }
            }
        } else {
            str += GetOpName(opcode);
        }
    }
    return str;
}